

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Material.cpp
# Opt level: O1

bool __thiscall
Dielectric::Scatter(Dielectric *this,Ray *ray_in,hit_record_t *hit_record,Vec3 *attenuation,
                   Ray *ray_out)

{
  float fVar1;
  float fVar2;
  Texture *pTVar3;
  undefined8 uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  Vec3 *pVVar8;
  float fVar9;
  float fVar10;
  uint extraout_XMM0_Db;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  uint uVar15;
  Vec3 _reflected;
  Vec3 _refracted;
  Vec3 local_a8;
  undefined1 local_98 [28];
  float local_7c;
  float local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  Ray *local_60;
  Vec3 local_54;
  Vec3 local_48;
  Vec3 local_3c;
  undefined1 auVar13 [16];
  
  local_a8.e._0_8_ = *(undefined8 *)(ray_in->m_direction).e;
  local_a8.e[2] = (ray_in->m_direction).e[2];
  pVVar8 = &hit_record->m_normal;
  local_60 = ray_out;
  reflect(&local_a8,pVVar8);
  pTVar3 = (this->super_Material).m_albedo;
  (*pTVar3->_vptr_Texture[2])(hit_record->m_u,&local_a8,pTVar3,&hit_record->m_point);
  attenuation->e[2] = local_a8.e[2];
  *(undefined8 *)attenuation->e = local_a8.e._0_8_;
  local_a8.e._0_8_ = *(undefined8 *)(ray_in->m_direction).e;
  local_a8.e[2] = (ray_in->m_direction).e[2];
  fVar9 = dot(&local_a8,pVVar8);
  if (fVar9 <= 0.0) {
    local_a8.e[2] = (hit_record->m_normal).e[2];
    local_a8.e._0_8_ = *(undefined8 *)pVVar8->e;
    local_98._0_4_ = this->m_ref_idx;
    local_98._4_4_ = 0;
    fVar10 = (ray_in->m_direction).e[0];
    fVar1 = (ray_in->m_direction).e[1];
    fVar2 = (ray_in->m_direction).e[2];
    uVar11 = 0;
    fVar10 = fVar2 * fVar2 + fVar10 * fVar10 + fVar1 * fVar1;
    if (fVar10 < 0.0) {
      local_98._0_16_ = ZEXT416((uint)local_98._0_4_);
      local_78 = -fVar9;
      uStack_74 = extraout_XMM0_Db ^ 0x80000000;
      uStack_70 = extraout_XMM0_Dc ^ 0x80000000;
      uStack_6c = extraout_XMM0_Dd ^ 0x80000000;
      fVar10 = sqrtf(fVar10);
      uVar11 = extraout_XMM0_Db_00;
      fVar9 = local_78;
      uVar15 = uStack_74;
    }
    else {
      fVar10 = SQRT(fVar10);
      fVar9 = -fVar9;
      uVar15 = extraout_XMM0_Db ^ 0x80000000;
    }
    auVar13._0_8_ = (undefined8)DAT_0011cf70;
    auVar13._8_4_ = DAT_0011cf70._4_4_;
    auVar13._12_4_ = uVar15;
    auVar12._8_8_ = auVar13._8_8_;
    auVar12._0_4_ = (undefined4)DAT_0011cf70;
    auVar12._4_4_ = fVar9;
    auVar6._4_4_ = fVar10;
    auVar6._0_4_ = local_98._0_4_;
    auVar6._8_4_ = local_98._4_4_;
    auVar6._12_4_ = uVar11;
    local_98._0_16_ = divps(auVar12,auVar6);
  }
  else {
    local_a8.e[2] = -(hit_record->m_normal).e[2];
    local_a8.e._0_8_ = *(ulong *)(hit_record->m_normal).e ^ 0x8000000080000000;
    local_98._0_16_ = ZEXT416((uint)this->m_ref_idx);
    fVar10 = (ray_in->m_direction).e[0];
    fVar1 = (ray_in->m_direction).e[1];
    fVar2 = (ray_in->m_direction).e[2];
    fVar10 = fVar2 * fVar2 + fVar10 * fVar10 + fVar1 * fVar1;
    if (fVar10 < 0.0) {
      local_78 = fVar9;
      uStack_74 = extraout_XMM0_Db;
      uStack_70 = extraout_XMM0_Dc;
      uStack_6c = extraout_XMM0_Dd;
      fVar10 = sqrtf(fVar10);
      fVar9 = local_78;
    }
    else {
      fVar10 = SQRT(fVar10);
    }
    uVar11 = 0;
    fVar9 = 1.0 - this->m_ref_idx * this->m_ref_idx * (1.0 - (fVar9 / fVar10) * (fVar9 / fVar10));
    if (fVar9 < 0.0) {
      fVar9 = sqrtf(fVar9);
      uVar11 = extraout_XMM0_Db_01;
    }
    else {
      fVar9 = SQRT(fVar9);
    }
    auVar14._8_4_ = SUB84(local_98._0_8_,4);
    auVar14._0_8_ = local_98._0_8_;
    auVar14._12_4_ = uVar11;
    local_98._8_8_ = auVar14._8_8_;
    local_98._4_4_ = fVar9;
  }
  local_48.e._0_8_ = *(undefined8 *)(ray_in->m_direction).e;
  local_48.e[2] = (ray_in->m_direction).e[2];
  bVar7 = refract(&local_48,&local_a8,local_98._0_4_,&local_3c);
  if (bVar7) {
    local_78 = (1.0 - this->m_ref_idx) / (this->m_ref_idx + 1.0);
    local_78 = local_78 * local_78;
    local_7c = 1.0 - local_78;
    fVar9 = powf(1.0 - (float)local_98._4_4_,5.0);
    fVar9 = fVar9 * local_7c + local_78;
  }
  else {
    fVar9 = 1.0;
  }
  local_98._0_4_ = fVar9;
  dVar5 = drand48();
  pVVar8 = &local_3c;
  if ((float)dVar5 < (float)local_98._0_4_) {
    pVVar8 = &local_54;
  }
  fVar9 = pVVar8->e[0];
  uVar4 = *(undefined8 *)(pVVar8->e + 1);
  fVar10 = ray_in->m_time;
  fVar1 = (hit_record->m_point).e[2];
  *(undefined8 *)(local_60->m_origin).e = *(undefined8 *)(hit_record->m_point).e;
  (local_60->m_origin).e[2] = fVar1;
  (local_60->m_direction).e[0] = fVar9;
  *(undefined8 *)((local_60->m_direction).e + 1) = uVar4;
  local_60->m_time = fVar10;
  return true;
}

Assistant:

bool
Dielectric::Scatter(const Ray& ray_in, hit_record_t& hit_record, Vec3& attenuation, Ray& ray_out) const
{
    Vec3 _reflected = reflect(ray_in.GetDirection(), hit_record.m_normal);
    attenuation     = m_albedo->GetValue(hit_record.m_u, hit_record.m_v, hit_record.m_point);
    
    float angle;
    float cosine;
    float ni_over_nt;
    Vec3  outward_normal;
    
    if ((angle = dot(ray_in.GetDirection(), hit_record.m_normal)) > 0.0f) {
        outward_normal = -hit_record.m_normal;
        ni_over_nt     = m_ref_idx;
        cosine = angle / ray_in.GetDirection().length(); // cosine *= m_ref_idx;
        cosine = sqrt(1.0f - m_ref_idx*m_ref_idx*(1.0f - cosine*cosine));
    }
    else {
        outward_normal = hit_record.m_normal;
        ni_over_nt     = 1.0f / m_ref_idx;
        cosine         = -angle / ray_in.GetDirection().length();
    }

    Vec3  _refracted;
    float _reflect_prob = 1.0f;
    if (refract(ray_in.GetDirection(), outward_normal, ni_over_nt, _refracted)) {
        _reflect_prob = schlick(cosine, m_ref_idx);
    }

    Vec3  _scattered = (RANDOM_GEN() < _reflect_prob) ? _reflected : _refracted;
    ray_out          = Ray(hit_record.m_point, _scattered, ray_in.GetTime());
    
    return true;
}